

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O0

char * helicsTranslatorGetInfo(HelicsTranslator trans)

{
  TranslatorObject *pTVar1;
  string *info;
  TranslatorObject *transObj;
  Interface *in_stack_ffffffffffffffd0;
  HelicsTranslator in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  pTVar1 = getTranslatorObj(in_stack_ffffffffffffffd8,(HelicsError *)in_stack_ffffffffffffffd0);
  if (pTVar1 == (TranslatorObject *)0x0) {
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffffd0);
  }
  else {
    helics::Interface::getInfo_abi_cxx11_(in_stack_ffffffffffffffd0);
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffffd0);
  }
  return local_8;
}

Assistant:

const char* helicsTranslatorGetInfo(HelicsTranslator trans)
{
    auto* transObj = getTranslatorObj(trans, nullptr);
    if (transObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& info = transObj->transPtr->getInfo();
        return info.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}